

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O1

void __thiscall
CTestResource_TestPlanar2D_RGBP_Unaligned_Test::TestBody
          (CTestResource_TestPlanar2D_RGBP_Unaligned_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  GMM_RESOURCE_INFO *ResourceInfo;
  char *pcVar5;
  undefined4 uVar6;
  int iVar7;
  uint ExpectedValue;
  long lVar9;
  undefined1 auStack_148 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  ulong uStack_b8;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertionResult gtest_ar_6;
  GMM_MULTI_TILE_ARCH GVar8;
  
  lVar9 = 0;
  do {
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.BaseHeight = 0;
    gmmParams.Depth = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    auStack_148._0_4_ = RESOURCE_2D;
    auStack_148._4_4_ = GMM_FORMAT_INVALID;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x1e0;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x10000012c;
    CTestResource::SetTileFlag
              (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)auStack_148,
               *(TEST_TILE_TYPE *)((long)&DAT_001ad600 + lVar9));
    auStack_148._4_4_ = GMM_FORMAT_RGBP;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,(GMM_RESCREATE_PARAMS *)auStack_148);
    if (lVar9 == 0) {
      ExpectedValue = gmmParams.CpTag + 0x3f & 0xffffffc0;
      uVar6 = gmmParams.field_6.BaseWidth;
    }
    else {
      iVar7 = *(int *)((long)&DAT_001ad610 + lVar9 * 2);
      iVar2 = *(int *)((long)&DAT_001ad614 + lVar9 * 2);
      ExpectedValue = -iVar7 & iVar7 + -1 + gmmParams.CpTag;
      uVar6 = -iVar2 & iVar2 + -1 + (gmmParams.field_6.BaseWidth + 0xf & 0xfffffff0);
    }
    GVar8.Reserved = 0;
    GVar8._0_4_ = ExpectedValue;
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,ExpectedValue);
    if (lVar9 != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                (&this->super_CTestResource,ResourceInfo,
                 ExpectedValue / *(uint *)((long)&DAT_001ad610 + lVar9 * 2));
    }
    uVar3 = uVar6 * 3;
    gmmParams.MultiTileArch = GVar8;
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo,
               (ulong)(uVar3 * ExpectedValue + 0xfff & 0xfffff000));
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ & 0xffffffff00000000;
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
               (int *)&gtest_ar_6.message_,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      psVar1 = &gtest_ar_6.message_;
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb95,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ & 0xffffffff00000000;
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
               (int *)&gtest_ar_6.message_,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      psVar1 = &gtest_ar_6.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb96,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ & 0xffffffff00000000;
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
               (int *)&gtest_ar_6.message_,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      psVar1 = &gtest_ar_6.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb99,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6.message_.ptr_._0_4_ = uVar3 / 3;
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&uStack_b8,"Height / 3","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",
               (uint *)&gtest_ar_6.message_,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      psVar1 = &gtest_ar_6.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ & 0xffffffff00000000;
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
               (int *)&gtest_ar_6.message_,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      psVar1 = &gtest_ar_6.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_6.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_6.message_.ptr_._4_4_,(int)((ulong)uVar3 * 0xaaaaaaab >> 0x20)) &
         0xfffffffffffffffe);
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
    psVar1 = &gtest_ar_6.message_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&uStack_b8,"2 * (Height / 3)",
               "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",(uint *)psVar1,
               (unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar5 = *(char **)OffsetInfo._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&OffsetInfo,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    OffsetInfo.Plane = GMM_NO_PLANE;
    OffsetInfo.StdLayout.Offset = 0;
    OffsetInfo.StdLayout.TileRowPitch = 0;
    OffsetInfo.Render.XOffset = 0;
    OffsetInfo.Render.YOffset = 0;
    OffsetInfo.Render.ZOffset = 0;
    OffsetInfo.Render._20_4_ = 0;
    OffsetInfo.Lock.Pitch = 0;
    OffsetInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    OffsetInfo.Render.field_0.Offset64 = 0;
    OffsetInfo.Frame = GMM_DISPLAY_BASE;
    OffsetInfo._28_4_ = 0;
    OffsetInfo.Lock.field_0.Offset64 = 0;
    uStack_b8 = 1;
    OffsetInfo._0_4_ = 0;
    OffsetInfo.ArrayIndex = 0;
    OffsetInfo.MipLevel = 0;
    OffsetInfo.Slice = 1;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    gtest_ar_6.message_.ptr_ = gtest_ar_6.message_.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_48,"0","OffsetInfo.Render.Offset64",(int *)&gtest_ar_6.message_,
               (unsigned_long *)&OffsetInfo.Lock.Pitch);
    if (local_48.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_6.message_);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xba7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar_6.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (gtest_ar_6.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar_6.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uStack_b8 = uStack_b8 | 1;
    OffsetInfo._0_8_ = OffsetInfo._0_8_ & 0xffffffff00000000;
    OffsetInfo.Slice = 2;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    iVar7 = (uVar3 / 3) * gmmParams.MultiTileArch._0_4_;
    gtest_ar_6.message_.ptr_._0_4_ = iVar7;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&local_48,"Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               (uint *)&gtest_ar_6.message_,(unsigned_long *)&OffsetInfo.Lock.Pitch);
    if (local_48.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_6.message_);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbae,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar_6.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (gtest_ar_6.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar_6.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uStack_b8 = uStack_b8 | 1;
    OffsetInfo._0_8_ = OffsetInfo._0_8_ & 0xffffffff00000000;
    OffsetInfo.Slice = 3;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    gtest_ar_6.message_.ptr_._0_4_ = iVar7 * 2;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&local_48,"2 * Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               (uint *)&gtest_ar_6.message_,(unsigned_long *)&OffsetInfo.Lock.Pitch);
    if (local_48.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_6.message_);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbb5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar_6.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (gtest_ar_6.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar_6.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0xc);
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_RGBP_Unaligned)
{
    /* Test planar surfaces where all planes are full-sized */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]       = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t       PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                     {512, 8},   // TileX
                                     {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 480;
        gmmParams.BaseHeight           = 300;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_RGBP;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;
        if(Tile != TEST_LINEAR)
        {
            Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            //Since Tile alignment factor is greater than GMM_IMCx_PLANE_ROW_ALIGNMENT=16
            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            Height = GMM_ULT_ALIGN(Height, TileSize[TileIndex][1]) * 3 /*Y, U, V*/;
        }
        else
        {
            Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
            Height = gmmParams.BaseHeight * 3 /*Y, U, V*/;
        }
        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }

        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(Height / 3, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(2 * (Height / 3), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        //Resource Offset
        //Y PLANE
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        OffsetInfo.Plane               = GMM_PLANE_Y;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);

        //U PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_U;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        // V PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_V;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(2 * Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}